

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

void __thiscall Assimp::XGLImporter::ReadWorld(XGLImporter *this,TempScope *scope)

{
  bool bVar1;
  int iVar2;
  aiNode *paVar3;
  string local_50;
  
  do {
    bVar1 = ReadElementUpToClosing(this,"world");
    if (!bVar1) break;
    GetElementName_abi_cxx11_(&local_50,this);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 == 0) {
      ReadLighting(this,scope);
LAB_005e53c6:
      bVar1 = true;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar2 != 0) goto LAB_005e53c6;
        }
      }
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  } while (bVar1);
  paVar3 = ReadObject(this,scope,true,"world");
  if ((paVar3->mName).length == 0) {
    (paVar3->mName).length = 5;
    builtin_strncpy((paVar3->mName).data,"WORLD",6);
  }
  this->m_scene->mRootNode = paVar3;
  return;
}

Assistant:

void XGLImporter::ReadWorld(TempScope& scope)
{
    while (ReadElementUpToClosing("world")) {
        const std::string& s = GetElementName();
        // XXX right now we'd skip <lighting> if it comes after
        // <object> or <mesh>
        if (s == "lighting") {
            ReadLighting(scope);
        }
        else if (s == "object" || s == "mesh" || s == "mat") {
            break;
        }
    }


    aiNode* const nd = ReadObject(scope,true,"world");
    if(!nd) {
        ThrowException("failure reading <world>");
    }
    if(!nd->mName.length) {
        nd->mName.Set("WORLD");
    }

    m_scene->mRootNode = nd;
}